

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_work.hpp
# Opt level: O0

void __thiscall
asio::detail::
handler_work<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>,asio::any_io_executor,void>
::
complete<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>,std::error_code>>
          (handler_work<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>,_asio::any_io_executor,_void>
           *this,binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>,_std::error_code>
                 *function,
          io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
          *handler)

{
  bool bVar1;
  binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>,_std::error_code>
  *in_RDI;
  binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>,_std::error_code>
  *in_stack_00000028;
  handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
  *in_stack_00000030;
  io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
  *in_stack_ffffffffffffffd8;
  
  bVar1 = handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
          owns_work((handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                     *)0x2945d2);
  if (bVar1) {
    handler_work_base<asio::any_io_executor,void,asio::io_context,asio::executor,void>::
    dispatch<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>,std::error_code>,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
              (in_stack_00000030,in_stack_00000028,
               (io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
                *)this);
  }
  else {
    asio_handler_invoke_helpers::
    invoke<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>,std::error_code>,asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>>
              (in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void complete(Function& function, Handler& handler)
  {
    if (!base1_type::owns_work())
    {
      // When using a native implementation, I/O completion handlers are
      // already dispatched according to the execution context's executor's
      // rules. We can call the function directly.
      asio_handler_invoke_helpers::invoke(function, handler);
    }
    else
    {
      base1_type::dispatch(function, handler);
    }
  }